

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__is_16_main(stbi__context *s)

{
  int iVar1;
  uint uVar2;
  stbi__png p;
  stbi__png local_38;
  
  local_38.s = s;
  iVar1 = stbi__parse_png_file(&local_38,2,0);
  if ((iVar1 != 0) && (local_38.depth == 0x10)) {
    return 1;
  }
  (local_38.s)->img_buffer = (local_38.s)->img_buffer_original;
  (local_38.s)->img_buffer_end = (local_38.s)->img_buffer_original_end;
  iVar1 = stbi__get16be(s);
  uVar2 = stbi__get16be(s);
  if (((uVar2 | iVar1 << 0x10) != 0x38425053) || (iVar1 = stbi__get16be(s), iVar1 != 1))
  goto LAB_001275ac;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00127563:
    s->img_buffer = s->img_buffer + 6;
  }
  else {
    iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (5 < iVar1) goto LAB_00127563;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar1);
  }
  uVar2 = stbi__get16be(s);
  if (uVar2 < 0x11) {
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    iVar1 = stbi__get16be(s);
    if (iVar1 == 0x10) {
      return 1;
    }
  }
LAB_001275ac:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   return 0;
}